

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_return_no_value::translate
          (method_return_no_value *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  _Elt_pointer pdVar1;
  int iVar2;
  token_value *ptVar3;
  statement_return *this_00;
  undefined4 extraout_var;
  _Elt_pointer pptVar4;
  size_t size;
  any local_48;
  tree_type<cs::token_base_*> tree;
  tree_type<cs::token_base_*> local_38;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_30;
  token_value *local_20;
  
  tree.mRoot = (tree_node *)0x0;
  ptVar3 = (token_value *)token_base::operator_new((token_base *)0x18,(size_t)context);
  cs_impl::any::any<cs::pointer>(&local_48,(pointer *)&null_pointer);
  (ptVar3->super_token_base).line_num = 1;
  (ptVar3->super_token_base)._vptr_token_base = (_func_int **)&PTR__token_value_00375648;
  (ptVar3->mVal).mDat = local_48.mDat;
  local_48.mDat = (proxy *)0x0;
  size = 0;
  local_20 = ptVar3;
  tree_type<cs::token_base*>::emplace_root_left<cs::token_value*>
            ((tree_type<cs::token_base*> *)&tree,(iterator)0x0,&local_20);
  cs_impl::any::recycle(&local_48);
  this_00 = (statement_return *)statement_base::operator_new((statement_base *)0x28,size);
  iVar2 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)tree.mRoot,(EVP_PKEY_CTX *)0x0);
  local_38.mRoot = (tree_node *)CONCAT44(extraout_var,iVar2);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar1 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar4 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar4 ==
      (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar4 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_return::statement_return(this_00,&local_38,(context_t *)&local_30,pptVar4[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  tree_type<cs::token_base_*>::~tree_type(&local_38);
  tree_type<cs::token_base_*>::~tree_type(&tree);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_return_no_value::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> tree;
		tree.emplace_root_left(tree.root(), new token_value(null_pointer));
		return new statement_return(tree, context, raw.front().back());
	}